

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardStringIterator.h
# Opt level: O1

ssize_t __thiscall
bwtil::BackwardStringIterator::read
          (BackwardStringIterator *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer pcVar1;
  ulong uVar2;
  
  if (this->position == 0) {
    return 0;
  }
  uVar2 = this->position - 1;
  this->position = uVar2;
  if (uVar2 < (this->in_str)._M_string_length) {
    pcVar1 = (this->in_str)._M_dataplus._M_p;
    return CONCAT71((int7)((ulong)pcVar1 >> 8),pcVar1[uVar2]);
  }
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

symbol read(){

		if(position>0){

			position--;
			return in_str.at(position);

		}

		return 0;

	}